

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::push_rr<(SM83::Registers)8>(SM83 *this)

{
  u16 word_reg;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_std::basic_string_view<char>_>
  fmt;
  anon_union_2_2_fd64ea96_for_SM83_2 *args_6;
  string_view local_30;
  v11 *local_20;
  char *local_18;
  SM83 *local_10;
  SM83 *this_local;
  
  local_20 = (v11 *)0x15b725;
  local_18 = (char *)0x45;
  args_6 = &this->field_1;
  local_10 = this;
  local_30 = Get16bitRegisterName<(SM83::Registers)8>(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = local_18;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,std::basic_string_view<char,std::char_traits<char>>>
            (local_20,fmt,&args_6->bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)&local_30,
             (basic_string_view<char,_std::char_traits<char>_> *)&args_6->field_1);
  word_reg = Get16bitRegister<(SM83::Registers)8>(this);
  StackPush(this,word_reg);
  Timer::AdvanceCycles(this->timer,4);
  return;
}

Assistant:

void SM83::push_rr() {
    LTRACE("PUSH {}", Get16bitRegisterName<Register>());
    StackPush(Get16bitRegister<Register>());

    timer.AdvanceCycles(4);
}